

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O3

BOOL InitDirectSound(void)

{
  BOOL BVar1;
  
  audio_backend_initialised = AudioBackend_Init();
  if (audio_backend_initialised) {
    memset(lpSECONDARYBUFFER,0,0x500);
    BVar1 = StartOrganya("Wave.dat");
    return BVar1;
  }
  return false;
}

Assistant:

BOOL InitDirectSound(void)
{
	int i;

	audio_backend_initialised = AudioBackend_Init();

	if (!audio_backend_initialised)
		return FALSE;

	for (i = 0; i < SE_MAX; i++)
		lpSECONDARYBUFFER[i] = NULL;

	if (!StartOrganya("Wave.dat"))
		return FALSE;

	return TRUE;
}